

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupGlobalMemoryAccountant::~TEST_GROUP_CppUTestGroupGlobalMemoryAccountant
          (TEST_GROUP_CppUTestGroupGlobalMemoryAccountant *this)

{
  TEST_GROUP_CppUTestGroupGlobalMemoryAccountant *this_local;
  
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalMemoryAccountant_00410de8;
  GlobalMemoryAccountantExecFunction::~GlobalMemoryAccountantExecFunction(&this->testFunction);
  TestTestingFixture::~TestTestingFixture(&this->fixture);
  GlobalMemoryAccountant::~GlobalMemoryAccountant(&this->accountant);
  Utest::~Utest(&this->super_Utest);
  return;
}

Assistant:

TEST_GROUP(GlobalMemoryAccountant)
{
    GlobalMemoryAccountant accountant;
    TestTestingFixture fixture;
    GlobalMemoryAccountantExecFunction testFunction;
    GlobalMemoryAllocatorStash stash;

    void setup() _override
    {
        testFunction.parameter_ = &accountant;
        fixture.setTestFunction(&testFunction);
        stash.save();
    }

    void teardown() _override
    {
        stash.restore();
    }
}